

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cecSplit.c
# Opt level: O1

void * Cec_GiaSplitWorkerThread(void *pArg)

{
  int iVar1;
  
  while( true ) {
    do {
    } while (*(int *)((long)pArg + 0x18) == 0);
    if (*pArg == (Gia_Man_t *)0x0) break;
    iVar1 = Cnf_GiaSolveOne(*pArg,*(Cnf_Dat_t **)((long)pArg + 8),*(int *)((long)pArg + 0x14),
                            (int *)((long)pArg + 0x20),(int *)((long)pArg + 0x24));
    *(int *)((long)pArg + 0x1c) = iVar1;
    *(undefined4 *)((long)pArg + 0x18) = 0;
  }
  pthread_exit((void *)0x0);
}

Assistant:

void * Cec_GiaSplitWorkerThread( void * pArg )
{
    Par_ThData_t * pThData = (Par_ThData_t *)pArg;
    volatile int * pPlace = &pThData->fWorking;
    while ( 1 )
    {
        while ( *pPlace == 0 );
        assert( pThData->fWorking );
        if ( pThData->p == NULL )
        {
            pthread_exit( NULL );
            assert( 0 );
            return NULL;
        }
        pThData->Result = Cnf_GiaSolveOne( pThData->p, pThData->pCnf, pThData->nTimeOut, &pThData->nVars, &pThData->nConfs );
        pThData->fWorking = 0;
    }
    assert( 0 );
    return NULL;
}